

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvpair.c
# Opt level: O0

uchar * nvpair_unpack_number_array(_Bool isbe,nvpair_t *nvp,uchar *ptr,size_t *leftp)

{
  ulong __size;
  int *piVar1;
  void *pvVar2;
  uint64_t uVar3;
  uint local_44;
  uint i;
  size_t size;
  uint64_t *value;
  size_t *leftp_local;
  uchar *ptr_local;
  nvpair_t *nvp_local;
  size_t *psStack_10;
  _Bool isbe_local;
  
  if (nvp->nvp_type == 9) {
    __size = nvp->nvp_nitems << 3;
    if ((((nvp->nvp_datasize == __size) && (__size <= *leftp)) && (nvp->nvp_nitems != 0)) &&
       (nvp->nvp_nitems <= __size)) {
      pvVar2 = malloc(__size);
      if (pvVar2 == (void *)0x0) {
        psStack_10 = (size_t *)0x0;
      }
      else {
        leftp_local = (size_t *)ptr;
        for (local_44 = 0; (ulong)local_44 < nvp->nvp_nitems; local_44 = local_44 + 1) {
          if (isbe) {
            uVar3 = be64dec(leftp_local);
            *(uint64_t *)((long)pvVar2 + (ulong)local_44 * 8) = uVar3;
          }
          else {
            uVar3 = le64dec(leftp_local);
            *(uint64_t *)((long)pvVar2 + (ulong)local_44 * 8) = uVar3;
          }
          leftp_local = leftp_local + 1;
          *leftp = *leftp - 8;
        }
        nvp->nvp_data = (uint64_t)pvVar2;
        psStack_10 = leftp_local;
      }
    }
    else {
      piVar1 = __errno_location();
      *piVar1 = 0x16;
      psStack_10 = (size_t *)0x0;
    }
    return (uchar *)psStack_10;
  }
  __assert_fail("nvp->nvp_type == 9",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvpair.c"
                ,0x398,
                "const unsigned char *nvpair_unpack_number_array(_Bool, nvpair_t *, const unsigned char *, size_t *)"
               );
}

Assistant:

const unsigned char *
nvpair_unpack_number_array(bool isbe, nvpair_t *nvp, const unsigned char *ptr,
     size_t *leftp)
{
	uint64_t *value;
	size_t size;
	unsigned int i;

	PJDLOG_ASSERT(nvp->nvp_type == NV_TYPE_NUMBER_ARRAY);

	size = sizeof(*value) * nvp->nvp_nitems;
	if (nvp->nvp_datasize != size || *leftp < size ||
	    nvp->nvp_nitems == 0 || size < nvp->nvp_nitems) {
		ERRNO_SET(EINVAL);
		return (NULL);
	}

	value = nv_malloc(size);
	if (value == NULL)
		return (NULL);

	for (i = 0; i < nvp->nvp_nitems; i++) {
		if (isbe)
			value[i] = be64dec(ptr);
		else
			value[i] = le64dec(ptr);

		ptr += sizeof(*value);
		*leftp -= sizeof(*value);
	}

	nvp->nvp_data = (uint64_t)(uintptr_t)value;

	return (ptr);
}